

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_scalar.cpp
# Opt level: O2

extent_float_t __thiscall
ear::PolarExtentCoreScalar::weight_stadium
          (PolarExtentCoreScalar *this,PolarExtentCoreContext *ctx,ExtentPosition *position)

{
  extent_float_t eVar1;
  ExtentPosition EVar2;
  
  EVar2 = ExtentPosition::transform(position,ctx->flippedBasis);
  if (ctx->circle_test[0] * ABS(EVar2.x) + ctx->circle_test[1] * EVar2.y < 0.0) {
    eVar1 = weight_from_cos(this,ctx,ABS(EVar2.x) * ctx->right_circle_centre[0] +
                                     EVar2.y * ctx->right_circle_centre[1]);
    return eVar1;
  }
  eVar1 = weight_from_sin(this,ctx,ABS(EVar2.z));
  return eVar1;
}

Assistant:

extent_float_t weight_stadium(PolarExtentCoreContext &ctx,
                                  const ExtentPosition &position) const {
      ExtentPosition position_t = position.transform(ctx.flippedBasis);

      ExtentPosition position_t_right = position_t;
      position_t_right.x = std::abs(position_t.x);

      auto circle_test_dot = position_t_right.x * ctx.circle_test[0] +
                             position_t_right.y * ctx.circle_test[1];
      bool in_straight_line_part = circle_test_dot >= 0.0;

      if (in_straight_line_part)
        return weight_from_sin(ctx, std::abs(position_t.z));
      else {
        auto circle_dot = position_t_right.x * ctx.right_circle_centre[0] +
                          position_t_right.y * ctx.right_circle_centre[1];
        return weight_from_cos(ctx, circle_dot);
      }
    }